

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O3

TypeGenericAlias * __thiscall
ExpressionContext::GetGenericAliasType(ExpressionContext *this,SynIdentifier *baseName)

{
  SmallArray<TypeGenericAlias_*,_128U> *this_00;
  uint uVar1;
  TypeBase **ppTVar2;
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  char *__function;
  ulong uVar6;
  ulong uVar7;
  InplaceStr name;
  TypeGenericAlias *pTVar5;
  
  this_00 = &this->genericAliasTypes;
  uVar6 = (ulong)(this->genericAliasTypes).count;
  if (uVar6 != 0) {
    uVar7 = 0;
    do {
      pTVar5 = this_00->data[uVar7];
      if ((pTVar5 != (TypeGenericAlias *)0x0) &&
         (bVar3 = InplaceStr::operator==(&pTVar5->baseName->name,&baseName->name), bVar3)) {
        return pTVar5;
      }
      uVar7 = uVar7 + 1;
    } while (uVar6 != uVar7);
  }
  iVar4 = (*this->allocator->_vptr_Allocator[2])(this->allocator,0x68);
  pTVar5 = (TypeGenericAlias *)CONCAT44(extraout_var,iVar4);
  name = GetGenericAliasTypeName(this,baseName->name);
  TypeGenericAlias::TypeGenericAlias(pTVar5,name,baseName);
  uVar1 = (this->genericAliasTypes).count;
  if (uVar1 == (this->genericAliasTypes).max) {
    SmallArray<TypeGenericAlias_*,_128U>::grow(this_00,uVar1);
  }
  if (this_00->data == (TypeGenericAlias **)0x0) {
    __function = 
    "void SmallArray<TypeGenericAlias *, 128>::push_back(const T &) [T = TypeGenericAlias *, N = 128]"
    ;
  }
  else {
    uVar1 = (this->genericAliasTypes).count;
    (this->genericAliasTypes).count = uVar1 + 1;
    this_00->data[uVar1] = pTVar5;
    uVar1 = (this->types).count;
    if (uVar1 == (this->types).max) {
      SmallArray<TypeBase_*,_128U>::grow(&this->types,uVar1);
    }
    ppTVar2 = (this->types).data;
    if (ppTVar2 != (TypeBase **)0x0) {
      uVar1 = (this->types).count;
      (this->types).count = uVar1 + 1;
      ppTVar2[uVar1] = (TypeBase *)pTVar5;
      return pTVar5;
    }
    __function = "void SmallArray<TypeBase *, 128>::push_back(const T &) [T = TypeBase *, N = 128]";
  }
  __assert_fail("data",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h",
                0x162,__function);
}

Assistant:

TypeGenericAlias* ExpressionContext::GetGenericAliasType(SynIdentifier *baseName)
{
	for(unsigned i = 0, e = genericAliasTypes.count; i < e; i++)
	{
		if(TypeGenericAlias *type = genericAliasTypes.data[i])
		{
			if(type->baseName->name == baseName->name)
				return type;
		}
	}

	// Create new type
	TypeGenericAlias* result = new (get<TypeGenericAlias>()) TypeGenericAlias(GetGenericAliasTypeName(*this, baseName->name), baseName);

	genericAliasTypes.push_back(result);
	types.push_back(result);

	return result;
}